

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_EmbeddedPartialAdditionTest_Test::TestBody
          (ComparisonTest_EmbeddedPartialAdditionTest_Test *this)

{
  anon_union_816_1_493b367e_for_TestAllTypes_11 *paVar1;
  TestAllTypes_NestedMessage *pTVar2;
  Arena *arena;
  char *message;
  AssertHelper AStack_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  pTVar2 = (this->super_ComparisonTest).proto1_.field_0._impl_.optional_nested_message_;
  if (pTVar2 != (TestAllTypes_NestedMessage *)0x0) {
    proto2_unittest::TestAllTypes_NestedMessage::Clear(pTVar2);
  }
  paVar1 = &(this->super_ComparisonTest).proto1_.field_0;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xdf;
  paVar1 = &(this->super_ComparisonTest).proto2_.field_0;
  *(byte *)paVar1 = *(byte *)paVar1 | 0x20;
  pTVar2 = (this->super_ComparisonTest).proto2_.field_0._impl_.optional_nested_message_;
  if (pTVar2 == (TestAllTypes_NestedMessage *)0x0) {
    arena = (Arena *)(this->super_ComparisonTest).proto2_.super_Message.super_MessageLite.
                     _internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pTVar2 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(arena);
    (this->super_ComparisonTest).proto2_.field_0._impl_.optional_nested_message_ = pTVar2;
  }
  (pTVar2->field_0)._impl_.bb_ = 0;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 & 0xfe;
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_40,this,&(this->super_ComparisonTest).proto1_.super_Message,
             &(this->super_ComparisonTest).proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[37],std::__cxx11::string>
            (local_50,"\"added: optional_nested_message: { }\\n\"","Run()",
             (char (*) [37])"added: optional_nested_message: { }\n",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd5b,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, EmbeddedPartialAdditionTest) {
  proto1_.clear_optional_nested_message();
  proto2_.mutable_optional_nested_message()->clear_bb();

  EXPECT_EQ("added: optional_nested_message: { }\n", Run());
}